

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMTrack.cpp
# Opt level: O2

void __thiscall
Storage::Disk::PCMTrack::add_segment
          (PCMTrack *this,Time *start_time,PCMSegment *segment,bool clamp_to_index_hole)

{
  _Bit_iterator *p_Var1;
  _Bit_type *p_Var2;
  _Bit_type *p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  _Bvector_impl *p_Var10;
  const_reference cVar11;
  PCMSegment *pPVar12;
  Time TVar13;
  ulong uVar14;
  ulong uVar15;
  undefined7 in_register_00000009;
  ulong uVar16;
  size_type __n;
  long lVar17;
  reference rVar18;
  _Bit_iterator __first;
  _Bit_iterator __first_00;
  _Bit_iterator __first_01;
  _Bit_iterator __first_02;
  _Bit_iterator __last;
  _Bit_iterator __last_00;
  _Bit_iterator __last_01;
  _Bit_iterator __last_02;
  bool local_54;
  bool local_53;
  bool local_52;
  bool local_51;
  ulong local_50;
  ulong local_48;
  vector<bool,_std::allocator<bool>_> *local_40;
  Time local_38;
  
  pPVar12 = PCMSegmentEventSource::segment
                      ((this->segment_event_sources_).
                       super__Vector_base<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  local_38 = PCMSegment::length(segment);
  TVar13 = Time::operator+(start_time,&local_38);
  local_40 = &pPVar12->data;
  p_Var2 = (pPVar12->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  p_Var1 = &(pPVar12->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish;
  uVar8 = (p_Var1->super__Bit_iterator_base)._M_p;
  uVar9 = (p_Var1->super__Bit_iterator_base)._M_offset;
  __last_02.super__Bit_iterator_base._M_offset = uVar9;
  __last_02.super__Bit_iterator_base._M_p = (_Bit_type *)uVar8;
  uVar16 = (ulong)(pPVar12->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
           ((long)(p_Var1->super__Bit_iterator_base)._M_p - (long)p_Var2) * 8;
  uVar14 = (start_time->length * uVar16) / (ulong)start_time->clock_rate;
  uVar15 = (((ulong)TVar13 & 0xffffffff) * uVar16) / ((ulong)TVar13 >> 0x20);
  local_48 = uVar15 - uVar14;
  local_50 = local_48 /
             (((long)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
              (long)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 0x10 +
             (ulong)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset * 2);
  if (((int)CONCAT71(in_register_00000009,clamp_to_index_hole) == 0) && (uVar16 < uVar15)) {
    if (local_48 < uVar16) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar16;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar15;
      uVar16 = SUB168(auVar5 % auVar4,0);
      __last.super__Bit_iterator_base._M_p =
           p_Var2 + (long)uVar16 / 0x40 +
                    (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff
      ;
      __last.super__Bit_iterator_base._M_offset = SUB164(auVar5 % auVar4,0) & 0x3f;
      local_53 = false;
      __first.super__Bit_iterator_base._8_8_ = 0;
      __first.super__Bit_iterator_base._M_p = p_Var2;
      __last.super__Bit_iterator_base._12_4_ = 0;
      std::__fill_a1(__first,__last,&local_53);
      __first_00.super__Bit_iterator_base._M_p =
           (pPVar12->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           (long)uVar14 / 0x40 +
           (ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
      __first_00.super__Bit_iterator_base._M_offset = (uint)uVar14 & 0x3f;
      p_Var10 = &(pPVar12->data).super__Bvector_base<std::allocator<bool>_>._M_impl;
      uVar6 = (p_Var10->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
      uVar7 = (p_Var10->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
      __last_00.super__Bit_iterator_base._M_offset = uVar7;
      __last_00.super__Bit_iterator_base._M_p = (_Bit_type *)uVar6;
      local_54 = false;
      __first_00.super__Bit_iterator_base._12_4_ = 0;
      __last_00.super__Bit_iterator_base._12_4_ = 0;
      std::__fill_a1(__first_00,__last_00,&local_54);
    }
    else {
      local_52 = false;
      __first_02.super__Bit_iterator_base._8_8_ = 0;
      __first_02.super__Bit_iterator_base._M_p = p_Var2;
      __last_02.super__Bit_iterator_base._12_4_ = 0;
      std::__fill_a1(__first_02,__last_02,&local_52);
    }
    p_Var2 = (segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    p_Var3 = (segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    uVar16 = (ulong)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
    lVar17 = uVar16 + ((long)p_Var3 - (long)p_Var2) * 8;
    local_50 = local_50 + uVar14;
    for (__n = ~((long)p_Var2 << 3) + uVar16 + (long)p_Var3 * 8; -1 < (long)__n; __n = __n - 1) {
      lVar17 = lVar17 + -1;
      cVar11 = std::vector<bool,_std::allocator<bool>_>::operator[](&segment->data,__n);
      if (cVar11) {
        uVar14 = (lVar17 * local_48) /
                 ((ulong)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                 ((long)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                 (long)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) +
                 local_50;
        uVar16 = (ulong)(pPVar12->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                 ((long)(pPVar12->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                 (long)(pPVar12->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
        if (uVar14 < uVar15 - uVar16) {
          return;
        }
        rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[](local_40,uVar14 % uVar16);
        *rVar18._M_p = *rVar18._M_p | rVar18._M_mask;
      }
    }
  }
  else {
    if (uVar16 < uVar15) {
      uVar15 = uVar16;
    }
    __first_01.super__Bit_iterator_base._M_offset = (uint)uVar14 & 0x3f;
    __last_01.super__Bit_iterator_base._M_p =
         p_Var2 + (long)uVar15 / 0x40 +
                  (ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
    local_51 = false;
    __first_01.super__Bit_iterator_base._M_p =
         p_Var2 + (long)uVar14 / 0x40 +
                  (ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
    __first_01.super__Bit_iterator_base._12_4_ = 0;
    __last_01.super__Bit_iterator_base._M_offset = (uint)uVar15 & 0x3f;
    __last_01.super__Bit_iterator_base._12_4_ = 0;
    std::__fill_a1(__first_01,__last_01,&local_51);
    local_50 = local_50 + uVar14;
    for (uVar16 = 0;
        uVar16 < (ulong)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                 ((long)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                 (long)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
        uVar16 = uVar16 + 1) {
      cVar11 = std::vector<bool,_std::allocator<bool>_>::operator[](&segment->data,uVar16);
      if (cVar11) {
        uVar15 = (uVar16 * local_48) /
                 ((ulong)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                 ((long)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                 (long)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) +
                 local_50;
        if ((ulong)(pPVar12->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
            ((long)(pPVar12->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
            (long)(pPVar12->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <= uVar15) {
          return;
        }
        rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[](local_40,uVar15);
        *rVar18._M_p = *rVar18._M_p | rVar18._M_mask;
      }
    }
  }
  return;
}

Assistant:

void PCMTrack::add_segment(const Time &start_time, const PCMSegment &segment, bool clamp_to_index_hole) {
	// Get a reference to the destination.
	PCMSegment &destination = segment_event_sources_.front().segment();

	// Determine the range to fill on the target segment.
	const Time end_time = start_time + segment.length();
	const size_t start_bit = start_time.length * destination.data.size() / start_time.clock_rate;
	const size_t end_bit = end_time.length * destination.data.size() / end_time.clock_rate;
	const size_t target_width = end_bit - start_bit;
	const size_t half_offset = target_width / (2 * segment.data.size());

	if(clamp_to_index_hole || end_bit <= destination.data.size()) {
		// If clamping is applied, just write a single segment, from the start_bit to whichever is
		// closer of the end of track and the end_bit.
		const size_t selected_end_bit = std::min(end_bit, destination.data.size());

		// Reset the destination.
		std::fill(destination.data.begin() + ptrdiff_t(start_bit), destination.data.begin() + ptrdiff_t(selected_end_bit), false);

		// Step through the source data from start to finish, stopping early if it goes out of bounds.
		for(size_t bit = 0; bit < segment.data.size(); ++bit) {
			if(segment.data[bit]) {
				const size_t output_bit = start_bit + half_offset + (bit * target_width) / segment.data.size();
				if(output_bit >= destination.data.size()) return;
				destination.data[output_bit] = true;
			}
		}
	} else {
		// Clamping is not enabled, so the supplied segment loops over the index hole, arbitrarily many times.
		// So work backwards unless or until the original start position is reached, then stop.

		// This definitely runs over the index hole; check whether the whole track needs clearing, or whether
		// a centre segment is untouched.
		if(target_width >= destination.data.size()) {
			std::fill(destination.data.begin(), destination.data.end(), false);
		} else {
			std::fill(destination.data.begin(), destination.data.begin() + ptrdiff_t(end_bit % destination.data.size()), false);
			std::fill(destination.data.begin() + ptrdiff_t(start_bit), destination.data.end(), false);
		}

		// Run backwards from final bit back to first, stopping early if overlapping the beginning.
		for(auto bit = ptrdiff_t(segment.data.size()-1); bit >= 0; --bit) {
			// Store flux transitions only; non-transitions can be ignored.
			if(segment.data[size_t(bit)]) {
				// Map to the proper output destination; stop if now potentially overwriting where we began.
				const size_t output_bit = start_bit + half_offset + (size_t(bit) * target_width) / segment.data.size();
				if(output_bit < end_bit - destination.data.size()) return;

				// Store.
				destination.data[output_bit % destination.data.size()] = true;
			}
		}
	}
}